

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

bool vkt::sr::anon_unknown_0::functionHasLod(Function function)

{
  undefined1 local_d;
  Function function_local;
  
  local_d = true;
  if ((((function != FUNCTION_TEXTURELOD) && (local_d = true, function != FUNCTION_TEXTUREPROJLOD))
      && (local_d = true, function != FUNCTION_TEXTUREPROJLOD2)) &&
     (local_d = true, function != FUNCTION_TEXTUREPROJLOD3)) {
    local_d = function == FUNCTION_TEXELFETCH;
  }
  return local_d;
}

Assistant:

inline bool functionHasLod (Function function)
{
	return function == FUNCTION_TEXTURELOD		||
		   function == FUNCTION_TEXTUREPROJLOD	||
		   function == FUNCTION_TEXTUREPROJLOD2	||
		   function == FUNCTION_TEXTUREPROJLOD3	||
		   function == FUNCTION_TEXELFETCH;
}